

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_FontGlyph * __thiscall
ON_Font::Internal_ManagedCodePointGlyph
          (ON_Font *this,ON__UINT32 unicode_code_point,bool bCreateIfMissing,bool bFindSubstitutes)

{
  bool bVar1;
  int iVar2;
  uint font_glyph_index_00;
  ON_FontGlyphCache *pOVar3;
  ON_GlyphMap *local_118;
  ON_TextBox local_108;
  ON_2dex local_e8;
  ON_TextBox normalized_glyph_box;
  double normalize_scale;
  undefined1 auStack_b8 [4];
  uint font_glyph_index;
  ON_TextBox font_unit_glyph_box;
  ON_FontGlyph glyph;
  ON_FontGlyph *managed_glyph;
  ON_GlyphMap *glyph_map;
  ON_FontGlyphCache *font_cache;
  bool bFindSubstitutes_local;
  bool bCreateIfMissing_local;
  ON__UINT32 unicode_code_point_local;
  ON_Font *this_local;
  
  iVar2 = ON_IsValidUnicodeCodePoint(unicode_code_point);
  if (iVar2 == 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x3443,"","invalid codepoint parameter.");
    this_local = (ON_Font *)0x0;
  }
  else {
    bVar1 = IsManagedFont(this);
    if (bVar1) {
      pOVar3 = FontGlyphCache(this,true);
      if (pOVar3 == (ON_FontGlyphCache *)0x0) {
        local_118 = (ON_GlyphMap *)0x0;
      }
      else {
        local_118 = std::__shared_ptr<ON_GlyphMap,_(__gnu_cxx::_Lock_policy)2>::get
                              (&(pOVar3->m_glyphmap).
                                super___shared_ptr<ON_GlyphMap,_(__gnu_cxx::_Lock_policy)2>);
      }
      if (local_118 == (ON_GlyphMap *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                   ,0x3455,"","Unable to create ON_FontGlyphCache.");
        this_local = (ON_Font *)0x0;
      }
      else {
        this_local = (ON_Font *)ON_GlyphMap::FindGlyph(local_118,unicode_code_point);
        if (this_local == (ON_Font *)0x0) {
          if (bCreateIfMissing) {
            ON_FontGlyph::ON_FontGlyph((ON_FontGlyph *)&font_unit_glyph_box.m_advance);
            ON_FontGlyph::SetCodePoint
                      ((ON_FontGlyph *)&font_unit_glyph_box.m_advance,this,unicode_code_point);
            _auStack_b8 = ON_TextBox::Unset.m_bbmin;
            font_unit_glyph_box.m_bbmin = ON_TextBox::Unset.m_bbmax;
            font_unit_glyph_box.m_bbmax = ON_TextBox::Unset.m_max_basepoint;
            font_unit_glyph_box.m_max_basepoint = ON_TextBox::Unset.m_advance;
            font_glyph_index_00 =
                 ON_ManagedFonts::GetGlyphMetricsInFontDesignUnits
                           (this,unicode_code_point,(ON_TextBox *)auStack_b8);
            if (font_glyph_index_00 != 0) {
              bVar1 = ON_TextBox::IsSet((ON_TextBox *)auStack_b8);
              if (bVar1) {
                font_unit_glyph_box.m_advance = _auStack_b8;
                normalized_glyph_box.m_advance = (ON_2dex)FontUnitToNormalizedScale(this);
                local_e8 = _auStack_b8;
                normalized_glyph_box.m_bbmin = font_unit_glyph_box.m_bbmin;
                normalized_glyph_box.m_bbmax = font_unit_glyph_box.m_bbmax;
                normalized_glyph_box.m_max_basepoint = font_unit_glyph_box.m_max_basepoint;
                if (0.0 < (double)normalized_glyph_box.m_advance) {
                  ON_TextBox::Scale(&local_108,(ON_TextBox *)auStack_b8,
                                    (double)normalized_glyph_box.m_advance);
                  local_e8 = local_108.m_bbmin;
                  normalized_glyph_box.m_bbmin = local_108.m_bbmax;
                  normalized_glyph_box.m_bbmax = local_108.m_max_basepoint;
                  normalized_glyph_box.m_max_basepoint = local_108.m_advance;
                }
              }
              ON_FontGlyph::Internal_SetFontGlyphIndex
                        ((ON_FontGlyph *)&font_unit_glyph_box.m_advance,font_glyph_index_00);
            }
            this_local = (ON_Font *)
                         ON_GlyphMap::InsertGlyph
                                   (local_118,(ON_FontGlyph *)&font_unit_glyph_box.m_advance);
          }
          else {
            this_local = (ON_Font *)0x0;
          }
        }
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                 ,0x3449,"","this->IsManagedFont() must be true.");
      this_local = (ON_Font *)0x0;
    }
  }
  return (ON_FontGlyph *)this_local;
}

Assistant:

const ON_FontGlyph* ON_Font::Internal_ManagedCodePointGlyph(
  ON__UINT32 unicode_code_point,
  bool bCreateIfMissing,
  bool bFindSubstitutes
) const
{
  if ( false == ON_IsValidUnicodeCodePoint(unicode_code_point) )
  {
    // valid UNICODE codepoint values are <= 0x10FFFF
    ON_ERROR("invalid codepoint parameter.");
    return nullptr;
  }

  if (false == IsManagedFont())
  {
    ON_ERROR("this->IsManagedFont() must be true.");
    return nullptr; 
  }
  
  // First see if we already have the glyph in the cache
  ON_FontGlyphCache* font_cache = FontGlyphCache(true);
  ON_GlyphMap* glyph_map
    = (nullptr == font_cache)
    ? nullptr
    : font_cache->m_glyphmap.get();
  if (nullptr == glyph_map)
  {
    ON_ERROR("Unable to create ON_FontGlyphCache.");
    return nullptr;
  }

  const ON_FontGlyph* managed_glyph = glyph_map->FindGlyph(unicode_code_point);
  if (nullptr != managed_glyph)
    return managed_glyph;

  if (false == bCreateIfMissing)
    return nullptr;

  ON_FontGlyph glyph;
  glyph.SetCodePoint(this, unicode_code_point);

  // Call external function to get glyph details
  ON_TextBox font_unit_glyph_box = ON_TextBox::Unset;
  const unsigned int font_glyph_index = ON_ManagedFonts::GetGlyphMetricsInFontDesignUnits(this, unicode_code_point, font_unit_glyph_box);
  if (0 != font_glyph_index)
  {
    if (font_unit_glyph_box.IsSet())
    {
      glyph.m_font_unit_glyph_bbox = font_unit_glyph_box;
      // Save a normalized box as well.
      const double normalize_scale = this->FontUnitToNormalizedScale();
      ON_TextBox normalized_glyph_box = font_unit_glyph_box;
      if (normalize_scale > 0.0)
        normalized_glyph_box = ON_TextBox::Scale(font_unit_glyph_box, normalize_scale);
      glyph.m_normalized_glyph_bbox = normalized_glyph_box;
    }
    glyph.Internal_SetFontGlyphIndex(font_glyph_index);
    bFindSubstitutes = false;
  }


  return glyph_map->InsertGlyph(glyph);
}